

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

void __thiscall
andres::Iterator<short,_true,_std::allocator<unsigned_long>_>::testInvariant
          (Iterator<short,_true,_std::allocator<unsigned_long>_> *this)

{
  View<short,_true,_std::allocator<unsigned_long>_> *pVVar1;
  reference psVar2;
  pointer puVar3;
  pointer puVar4;
  unsigned_long uVar5;
  bool bVar6;
  reference psVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  size_t j;
  ulong uVar11;
  size_t j_1;
  allocator_type local_39;
  vector<unsigned_long,_std::allocator<unsigned_long>_> testCoord;
  
  if ((this->view_ != (view_pointer)0x0) && (uVar11 = *(ulong *)(this->view_ + 0x30), uVar11 != 0))
  {
    marray_detail::Assert<bool>(this->index_ <= uVar11);
    sVar8 = this->index_;
    pVVar1 = this->view_;
    psVar2 = this->pointer_;
    if (sVar8 == *(size_t *)(pVVar1 + 0x30)) {
      psVar7 = View<short,_true,_std::allocator<unsigned_long>_>::operator()(pVVar1,sVar8 - 1);
      psVar7 = psVar7 + 1;
    }
    else {
      psVar7 = View<short,_true,_std::allocator<unsigned_long>_>::operator()(pVVar1,sVar8);
    }
    marray_detail::Assert<bool>(psVar2 == psVar7);
    bVar6 = View<short,_true,_std::allocator<unsigned_long>_>::isSimple(this->view_);
    if (!bVar6) {
      puVar3 = (this->coordinates_).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      puVar4 = (this->coordinates_).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      sVar8 = View<short,_true,_std::allocator<unsigned_long>_>::dimension(this->view_);
      marray_detail::Assert<bool>((long)puVar3 - (long)puVar4 >> 3 == sVar8);
      pVVar1 = this->view_;
      if (this->index_ == *(size_t *)(pVVar1 + 0x30)) {
        View<short,_true,_std::allocator<unsigned_long>_>::testInvariant(pVVar1);
        if (*(int *)(pVVar1 + 0x38) == 1) {
          sVar8 = *(this->coordinates_).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          sVar9 = View<short,_true,_std::allocator<unsigned_long>_>::shape(this->view_,0);
          marray_detail::Assert<bool>(sVar8 == sVar9);
          for (uVar11 = 1;
              puVar3 = (this->coordinates_).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start,
              uVar11 < (ulong)((long)(this->coordinates_).
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 3)
              ; uVar11 = uVar11 + 1) {
            uVar5 = puVar3[uVar11];
            sVar8 = View<short,_true,_std::allocator<unsigned_long>_>::shape(this->view_,uVar11);
            marray_detail::Assert<bool>(uVar5 == sVar8 - 1);
          }
        }
        else {
          sVar9 = View<short,_true,_std::allocator<unsigned_long>_>::dimension(this->view_);
          sVar8 = (this->coordinates_).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start[sVar9 - 1];
          sVar10 = View<short,_true,_std::allocator<unsigned_long>_>::shape(this->view_,sVar9 - 1);
          marray_detail::Assert<bool>(sVar8 == sVar10);
          for (sVar8 = 0; sVar9 - 1 != sVar8; sVar8 = sVar8 + 1) {
            uVar5 = (this->coordinates_).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start[sVar8];
            sVar10 = View<short,_true,_std::allocator<unsigned_long>_>::shape(this->view_,sVar8);
            marray_detail::Assert<bool>(uVar5 == sVar10 - 1);
          }
        }
      }
      else {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  (&testCoord,
                   (long)(this->coordinates_).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(this->coordinates_).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3,&local_39);
        View<short,true,std::allocator<unsigned_long>>::
        indexToCoordinates<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                  ((View<short,true,std::allocator<unsigned_long>> *)this->view_,this->index_,
                   (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    )testCoord.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start);
        for (uVar11 = 0;
            puVar3 = (this->coordinates_).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start,
            uVar11 < (ulong)((long)(this->coordinates_).
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 3);
            uVar11 = uVar11 + 1) {
          marray_detail::Assert<bool>
                    (puVar3[uVar11] ==
                     testCoord.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar11]);
        }
        std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                  (&testCoord.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      }
    }
    return;
  }
  bVar6 = false;
  if (((this->coordinates_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_finish ==
       (this->coordinates_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_start) && (bVar6 = false, this->index_ == 0)) {
    bVar6 = this->pointer_ == (pointer)0x0;
  }
  marray_detail::Assert<bool>(bVar6);
  return;
}

Assistant:

inline void 
Iterator<T, isConst, A>::testInvariant() const
{
    if(!MARRAY_NO_DEBUG) {
        if(view_ == 0) { 
            marray_detail::Assert(coordinates_.size() == 0 
                && index_ == 0
                && pointer_ == 0);
        }
        else { 
            if(view_->size() == 0) { // un-initialized view
                marray_detail::Assert(coordinates_.size() == 0 
                    && index_ == 0
                    && pointer_ == 0);
            }
            else { // initialized view
                marray_detail::Assert(index_ >= 0 && index_ <= view_->size());
                if(index_ == view_->size()) { // end iterator
                    marray_detail::Assert(pointer_ == &((*view_)(view_->size()-1)) + 1);
                }
                else {
                    marray_detail::Assert(pointer_ == &((*view_)(index_)));
                }
                if(!view_->isSimple()) {
                    marray_detail::Assert(coordinates_.size() == view_->dimension());
                    if(index_ == view_->size()) { // end iterator
                        if(view_->coordinateOrder() == LastMajorOrder) {
                            marray_detail::Assert(coordinates_[0] == view_->shape(0));
                            for(std::size_t j=1; j<coordinates_.size(); ++j) {
                                marray_detail::Assert(coordinates_[j] == view_->shape(j)-1);
                            }
                        }
                        else { // FirstMajorOrder
                            std::size_t d = view_->dimension() - 1;
                            marray_detail::Assert(coordinates_[d] == view_->shape(d));
                            for(std::size_t j=0; j<d; ++j) {
                                marray_detail::Assert(coordinates_[j] == view_->shape(j)-1);
                            }
                        }
                    }
                    else {
                        std::vector<std::size_t> testCoord(coordinates_.size());
                        view_->indexToCoordinates(index_, testCoord.begin());
                        for(std::size_t j=0; j<coordinates_.size(); ++j) {
                            marray_detail::Assert(coordinates_[j] == testCoord[j]);
                        }
                    }
                }
            }
        }
    }
}